

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_part_file.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::posix_part_file::posix_part_file
          (posix_part_file *this,string *path,string *name,int num_pieces,int piece_size)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  byte bVar4;
  pointer pcVar5;
  iterator __position;
  undefined8 uVar6;
  uint uVar7;
  size_t sVar8;
  mapped_type *pmVar9;
  int *piVar10;
  uint uVar11;
  long lVar12;
  key_type kVar13;
  long lVar14;
  int iVar15;
  file_pointer f;
  vector<char,_std::allocator<char>_> header;
  error_code ec;
  key_type local_a4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  undefined1 local_98 [32];
  _Alloc_hider local_78;
  size_type local_70;
  undefined1 local_68 [16];
  vector<bool,_std::allocator<bool>_> local_58;
  
  paVar1 = &(this->m_path).field_2;
  (this->m_path)._M_dataplus._M_p = (pointer)paVar1;
  pcVar5 = (path->_M_dataplus)._M_p;
  paVar2 = &path->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar2) {
    uVar6 = *(undefined8 *)((long)&path->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_path).field_2 + 8) = uVar6;
  }
  else {
    (this->m_path)._M_dataplus._M_p = pcVar5;
    (this->m_path).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_path)._M_string_length = path->_M_string_length;
  (path->_M_dataplus)._M_p = (pointer)paVar2;
  path->_M_string_length = 0;
  (path->field_2)._M_local_buf[0] = '\0';
  paVar2 = &(this->m_name).field_2;
  (this->m_name)._M_dataplus._M_p = (pointer)paVar2;
  pcVar5 = (name->_M_dataplus)._M_p;
  paVar3 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar3) {
    uVar6 = *(undefined8 *)((long)&name->field_2 + 8);
    paVar2->_M_allocated_capacity = paVar3->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_name).field_2 + 8) = uVar6;
  }
  else {
    (this->m_name)._M_dataplus._M_p = pcVar5;
    (this->m_name).field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
  }
  (this->m_name)._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar3;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  local_98._8_8_ = &this->m_free_slots;
  *(undefined8 *)
   ((long)&(this->m_free_slots).
           super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_free_slots).
           super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->m_free_slots).
  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_free_slots).
  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_max_pieces = num_pieces;
  this->m_piece_size = piece_size;
  this->m_header_size = num_pieces * 4 + 0x407U & 0xfffffc00;
  this->m_dirty_metadata = false;
  local_98._16_8_ = &this->m_piece_map;
  (this->m_piece_map)._M_h._M_buckets = &(this->m_piece_map)._M_h._M_single_bucket;
  (this->m_piece_map)._M_h._M_bucket_count = 1;
  (this->m_piece_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_piece_map)._M_h._M_element_count = 0;
  (this->m_piece_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_piece_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_piece_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_68._0_4_ = 0;
  local_68[4] = '\0';
  local_68._8_8_ = &boost::system::detail::cat_holder<void>::system_category_instance;
  open_file((posix_part_file *)local_98,(open_mode)this,(error_code *)0x0);
  if (local_68[4] != '\x01') {
    ::std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)(local_98 + 0x18),(long)this->m_header_size,
               (allocator_type *)&local_58);
    sVar8 = fread((void *)local_98._24_8_,1,(long)local_78._M_p - local_98._24_8_,
                  (FILE *)local_98._0_8_);
    uVar6 = local_98._24_8_;
    if (sVar8 == (long)local_78._M_p - local_98._24_8_) {
      if ((ulong)(long)this->m_header_size <= sVar8) {
        lVar12 = 0;
        uVar7 = 0;
        do {
          uVar7 = (uint)*(byte *)(local_98._24_8_ + lVar12) | uVar7 << 8;
          lVar12 = lVar12 + 1;
        } while ((int)lVar12 != 4);
        uVar11 = 0;
        lVar12 = 4;
        do {
          uVar11 = (uint)*(byte *)(local_98._24_8_ + lVar12) | uVar11 << 8;
          lVar12 = lVar12 + 1;
        } while ((int)lVar12 != 8);
        if ((uVar7 == num_pieces) && (this->m_piece_size == uVar11)) {
          local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_offset = 0;
          local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset = 0;
          local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage = (_Bit_pointer)0x0;
          local_a0 = paVar1;
          ::std::vector<bool,_std::allocator<bool>_>::resize(&local_58,(long)num_pieces,true);
          local_a4.m_val = 0;
          if (0 < num_pieces) {
            lVar12 = uVar6 + 8;
            do {
              lVar14 = 0;
              uVar7 = 0;
              do {
                iVar15 = uVar7 * 0x100;
                bVar4 = *(byte *)(lVar12 + lVar14);
                uVar7 = iVar15 + (uint)bVar4;
                lVar14 = lVar14 + 1;
              } while ((int)lVar14 != 4);
              if ((int)uVar7 < num_pieces && -1 < iVar15) {
                if ((this->m_num_allocated).m_val <= (int)uVar7) {
                  (this->m_num_allocated).m_val = uVar7 + 1;
                }
                bVar4 = bVar4 & 0x3f;
                *(ulong *)((long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                          (ulong)(uVar7 >> 6) * 2 * 4) =
                     *(ulong *)((long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                      _M_p + (ulong)(uVar7 >> 6) * 2 * 4) &
                     (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
                pmVar9 = ::std::__detail::
                         _Map_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)local_98._16_8_,&local_a4);
                pmVar9->m_val = uVar7;
              }
              lVar12 = lVar12 + 4;
              local_a4.m_val = local_a4.m_val + 1;
            } while (local_a4.m_val < num_pieces);
          }
          uVar6 = local_98._8_8_;
          local_a4.m_val = 0;
          if (0 < (this->m_num_allocated).m_val) {
            do {
              kVar13.m_val = local_a4.m_val + 0x3f;
              if (-1 < local_a4.m_val) {
                kVar13.m_val = local_a4.m_val;
              }
              if ((*(ulong *)((long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                             + ((long)(kVar13.m_val >> 6) * 2 +
                               (ulong)(((long)local_a4.m_val & 0x800000000000003fU) <
                                      0x8000000000000001) * 2 + -2) * 4) >>
                   ((long)local_a4.m_val & 0x3fU) & 1) != 0) {
                __position._M_current =
                     (this->m_free_slots).
                     super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (this->m_free_slots).
                    super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  ::std::
                  vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>>>
                  ::
                  _M_realloc_insert<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>const&>
                            ((vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>>>
                              *)uVar6,__position,
                             (strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void> *)
                             &local_a4);
                }
                else {
                  (__position._M_current)->m_val = local_a4.m_val;
                  (this->m_free_slots).
                  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
                }
              }
              local_a4.m_val = local_a4.m_val + 1;
            } while (local_a4.m_val < (this->m_num_allocated).m_val);
          }
          if ((pointer)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
              (pointer)0x0) {
            operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                            (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_end_of_storage -
                            (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
            local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_offset = 0;
            local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          }
        }
      }
    }
    else {
      piVar10 = __errno_location();
      local_68._0_4_ = *piVar10;
      local_68[4] = local_68._0_4_ != 0;
      local_68._8_8_ = &boost::system::detail::cat_holder<void>::generic_category_instance;
    }
    if ((void *)local_98._24_8_ != (void *)0x0) {
      operator_delete((void *)local_98._24_8_,local_70 - local_98._24_8_);
    }
  }
  if ((FILE *)local_98._0_8_ != (FILE *)0x0) {
    fclose((FILE *)local_98._0_8_);
  }
  return;
}

Assistant:

posix_part_file::posix_part_file(std::string path, std::string name
		, int const num_pieces, int const piece_size)
		: m_path(std::move(path))
		, m_name(std::move(name))
		, m_max_pieces(num_pieces)
		, m_piece_size(piece_size)
		, m_header_size(round_up((2 + num_pieces) * 4))
	{
		TORRENT_ASSERT(num_pieces > 0);
		TORRENT_ASSERT(m_piece_size > 0);

		error_code ec;
		auto f = open_file(open_mode::read_only, ec);
		if (ec) return;

		// parse header
		std::vector<char> header(static_cast<std::size_t>(m_header_size));
		auto const n = std::fread(header.data(), 1, header.size(), f.file());
		if (std::size_t(n) != header.size())
		{
			ec.assign(errno, generic_category());
			return;
		}

		// we don't have a full header. consider the file empty
		if (n < std::size_t(m_header_size)) return;
		using namespace libtorrent::aux;

		char* ptr = header.data();
		// we have a header. Parse it
		int const num_pieces_ = int(read_uint32(ptr));
		int const piece_size_ = int(read_uint32(ptr));

		// if there is a mismatch in number of pieces or piece size
		// consider the file empty and overwrite anything in there
		if (num_pieces != num_pieces_ || m_piece_size != piece_size_) return;

		// this is used to determine which slots are free, and how many
		// slots are allocated
		aux::vector<bool, slot_index_t> free_slots;
		free_slots.resize(num_pieces, true);

		for (auto i = piece_index_t(0); i < piece_index_t(num_pieces); ++i)
		{
			slot_index_t const slot(read_int32(ptr));
			if (static_cast<int>(slot) < 0) continue;

			// invalid part-file
			TORRENT_ASSERT(slot < slot_index_t(num_pieces));
			if (slot >= slot_index_t(num_pieces)) continue;

			if (slot >= m_num_allocated)
				m_num_allocated = next(slot);

			free_slots[slot] = false;
			m_piece_map[i] = slot;
		}

		// now, populate the free_list with the "holes"
		for (slot_index_t i(0); i < m_num_allocated; ++i)
		{
			if (free_slots[i]) m_free_slots.push_back(i);
		}
	}